

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O3

void __thiscall
kratos::MergeWireAssignmentsVisitor::process_stmt_block
          (MergeWireAssignmentsVisitor *this,StmtBlock *block)

{
  _Rb_tree_node_base *p_Var1;
  undefined1 local_80 [8];
  set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  stmts_to_remove;
  set<std::shared_ptr<kratos::AssignStmt>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  sliced_stmts;
  
  stmts_to_remove._M_t._M_impl._0_4_ = 0;
  stmts_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  stmts_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  stmts_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  sliced_stmts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&sliced_stmts;
  sliced_stmts._M_t._M_impl._0_4_ = 0;
  sliced_stmts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sliced_stmts._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  sliced_stmts._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  stmts_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Rb_tree_node_base *)&stmts_to_remove;
  stmts_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Rb_tree_node_base *)&stmts_to_remove;
  sliced_stmts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       sliced_stmts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  extract_sliced_stmts
            (block,(set<std::shared_ptr<kratos::AssignStmt>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                    *)&stmts_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count);
  get_stmts_to_remove<kratos::StmtBlock>
            (this,block,
             (set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
              *)local_80,
             (set<std::shared_ptr<kratos::AssignStmt>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
              *)&stmts_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count);
  for (p_Var1 = stmts_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var1 != (_Rb_tree_node_base *)&stmts_to_remove;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    (*(block->super_Stmt).super_IRNode._vptr_IRNode[10])(block,p_Var1 + 1);
  }
  std::
  _Rb_tree<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::_Identity<std::shared_ptr<kratos::AssignStmt>_>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::_Identity<std::shared_ptr<kratos::AssignStmt>_>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
               *)&stmts_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::shared_ptr<kratos::Stmt>,_std::shared_ptr<kratos::Stmt>,_std::_Identity<std::shared_ptr<kratos::Stmt>_>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<kratos::Stmt>,_std::shared_ptr<kratos::Stmt>,_std::_Identity<std::shared_ptr<kratos::Stmt>_>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
               *)local_80);
  return;
}

Assistant:

void process_stmt_block(StmtBlock* block) {
        std::set<std::shared_ptr<Stmt>> stmts_to_remove;

        // first filter out sliced assignments
        std::set<std::shared_ptr<AssignStmt>> sliced_stmts;
        extract_sliced_stmts(block, sliced_stmts);
        get_stmts_to_remove(block, stmts_to_remove, sliced_stmts);
        for (auto const& stmt : stmts_to_remove) block->remove_stmt(stmt);
    }